

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcconn.c
# Opt level: O2

void ipc_doread(ipc_conn *c)

{
  void *pvVar1;
  nni_iov *pnVar2;
  int __fd;
  uint uVar3;
  nng_err result;
  nni_aio *aio;
  ulong uVar4;
  ssize_t sVar5;
  size_t count;
  int *piVar6;
  int __count;
  long lVar7;
  undefined1 local_148 [8];
  iovec iovec [16];
  nni_iov *local_40;
  nni_iov *aiov;
  uint naiov;
  
  if ((c->closed == false) && (__fd = nni_posix_pfd_fd(&c->pfd), -1 < __fd)) {
    do {
      while( true ) {
        while( true ) {
          aio = (nni_aio *)nni_list_first(&c->readq);
          if (aio == (nni_aio *)0x0) {
            return;
          }
          nni_aio_get_iov(aio,(uint *)((long)&aiov + 4),&local_40);
          pnVar2 = local_40;
          uVar4 = (ulong)aiov._4_4_;
          if (uVar4 < 0x11) break;
          nni_aio_list_remove(aio);
          nni_aio_finish_error(aio,NNG_EINVAL);
        }
        __count = 0;
        for (lVar7 = 0; uVar4 << 4 != lVar7; lVar7 = lVar7 + 0x10) {
          pvVar1 = *(void **)((long)&pnVar2->iov_len + lVar7);
          if (pvVar1 != (void *)0x0) {
            iovec[__count].iov_base = pvVar1;
            iovec[(long)__count + -1].iov_len = *(size_t *)((long)&pnVar2->iov_buf + lVar7);
            __count = __count + 1;
          }
        }
        sVar5 = readv(__fd,(iovec *)local_148,__count);
        uVar3 = (uint)sVar5;
        if ((int)uVar3 < 0) break;
        if (uVar3 == 0) {
          nni_aio_list_remove(aio);
          nni_aio_finish_error(aio,NNG_ECONNSHUT);
        }
        else {
          nni_aio_bump_count(aio,(ulong)(uVar3 & 0x7fffffff));
          nni_aio_list_remove(aio);
          count = nni_aio_count(aio);
          nni_aio_finish(aio,NNG_OK,count);
        }
      }
      piVar6 = __errno_location();
    } while (*piVar6 == 4);
    if (*piVar6 != 0xb) {
      nni_aio_list_remove(aio);
      result = nni_plat_errno(*piVar6);
      nni_aio_finish_error(aio,result);
    }
  }
  return;
}

Assistant:

static void
ipc_doread(ipc_conn *c)
{
	nni_aio *aio;
	int      fd;

	if (c->closed || ((fd = nni_posix_pfd_fd(&c->pfd)) < 0)) {
		return;
	}

	while ((aio = nni_list_first(&c->readq)) != NULL) {
		unsigned     i;
		int          n;
		int          niov;
		unsigned     naiov;
		nni_iov     *aiov;
		struct iovec iovec[16];

		nni_aio_get_iov(aio, &naiov, &aiov);
		if (naiov > NNI_NUM_ELEMENTS(iovec)) {
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, NNG_EINVAL);
			continue;
		}
		for (niov = 0, i = 0; i < naiov; i++) {
			if (aiov[i].iov_len != 0) {
				iovec[niov].iov_len  = aiov[i].iov_len;
				iovec[niov].iov_base = aiov[i].iov_buf;
				niov++;
			}
		}

		if ((n = readv(fd, iovec, niov)) < 0) {
			switch (errno) {
			case EINTR:
				continue;
			case EAGAIN:
				return;
			default:
				nni_aio_list_remove(aio);
				nni_aio_finish_error(
				    aio, nni_plat_errno(errno));
				return;
			}
		}

		if (n == 0) {
			// Zero indicates a closed descriptor.
			// This implicitly completes this (all!) aio.
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, NNG_ECONNSHUT);
			continue;
		}

		nni_aio_bump_count(aio, n);

		// We completed the entire operation on this aio.
		nni_aio_list_remove(aio);
		nni_aio_finish(aio, 0, nni_aio_count(aio));

		// Go back to start of loop to see if there is another
		// aio ready for us to process.
	}
}